

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namedentity.cpp
# Opt level: O2

string * __thiscall
libcellml::NamedEntity::name_abi_cxx11_(string *__return_storage_ptr__,NamedEntity *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)(this->super_ParentedEntity).super_Entity.mPimpl[1].mId.field_2._M_local_buf)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string NamedEntity::name() const
{
    return pFunc()->mName;
}